

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_start.c
# Opt level: O1

int str_start(char *s,char *t)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (t[lVar3] == '\0') {
      return 1;
    }
    if (t[lVar3] != s[lVar3]) {
      return 0;
    }
    if (t[lVar3 + 1] == '\0') {
      return 1;
    }
    if (t[lVar3 + 1] != s[lVar3 + 1]) {
      return 0;
    }
    if (t[lVar3 + 2] == '\0') {
      return 1;
    }
    if (t[lVar3 + 2] != s[lVar3 + 2]) {
      return 0;
    }
    lVar1 = lVar3 + 3;
    if (t[lVar1] == '\0') {
      return 1;
    }
    lVar2 = lVar3 + 3;
    lVar3 = lVar3 + 4;
  } while (t[lVar1] == s[lVar2]);
  return 0;
}

Assistant:

int str_start(register const char *s,register const char *t)
{
  register char x;

  for (;;) {
    x = *t++; if (!x) return 1; if (x != *s++) return 0;
    x = *t++; if (!x) return 1; if (x != *s++) return 0;
    x = *t++; if (!x) return 1; if (x != *s++) return 0;
    x = *t++; if (!x) return 1; if (x != *s++) return 0;
  }
}